

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O3

WebPEncodingError WriteImage(WebPPicture *pic,VP8LBitWriter *bw,size_t *coded_size)

{
  uint8_t *puVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  long lVar5;
  WebPEncodingError WVar6;
  ulong uVar7;
  uint8_t pad_byte [1];
  uint local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 uStack_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  
  puVar3 = VP8LBitWriterFinish(bw);
  lVar5 = (long)(bw->used_ + 7 >> 3);
  puVar1 = bw->cur_ + (lVar5 - (long)bw->buf_);
  puVar4 = bw->cur_ + (lVar5 - (long)bw->buf_) + 1;
  uVar7 = (ulong)((uint)puVar4 & 1);
  iStack_44 = (int)(puVar1 + uVar7) + 0xd;
  local_48 = 0x46464952;
  uStack_40 = 0x50424557;
  uStack_3c = 0x4c385056;
  uStack_34 = 0x2f;
  uStack_38 = SUB81(puVar4,0);
  uStack_37 = (undefined1)((ulong)puVar4 >> 8);
  uStack_36 = (undefined1)((ulong)puVar4 >> 0x10);
  uStack_35 = (undefined1)((ulong)puVar4 >> 0x18);
  iVar2 = (*pic->writer)((uint8_t *)&local_48,0x15,pic);
  WVar6 = VP8_ENC_ERROR_BAD_WRITE;
  if ((iVar2 != 0) && (iVar2 = (*pic->writer)(puVar3,(size_t)puVar1,pic), iVar2 != 0)) {
    if (uVar7 != 0) {
      local_48 = local_48 & 0xffffff00;
      iVar2 = (*pic->writer)((uint8_t *)&local_48,1,pic);
      if (iVar2 == 0) {
        return VP8_ENC_ERROR_BAD_WRITE;
      }
    }
    *coded_size = (size_t)(puVar1 + uVar7 + 0x15);
    WVar6 = VP8_ENC_OK;
  }
  return WVar6;
}

Assistant:

static WebPEncodingError WriteImage(const WebPPicture* const pic,
                                    VP8LBitWriter* const bw,
                                    size_t* const coded_size) {
  WebPEncodingError err = VP8_ENC_OK;
  const uint8_t* const webpll_data = VP8LBitWriterFinish(bw);
  const size_t webpll_size = VP8LBitWriterNumBytes(bw);
  const size_t vp8l_size = VP8L_SIGNATURE_SIZE + webpll_size;
  const size_t pad = vp8l_size & 1;
  const size_t riff_size = TAG_SIZE + CHUNK_HEADER_SIZE + vp8l_size + pad;

  err = WriteRiffHeader(pic, riff_size, vp8l_size);
  if (err != VP8_ENC_OK) goto Error;

  if (!pic->writer(webpll_data, webpll_size, pic)) {
    err = VP8_ENC_ERROR_BAD_WRITE;
    goto Error;
  }

  if (pad) {
    const uint8_t pad_byte[1] = { 0 };
    if (!pic->writer(pad_byte, 1, pic)) {
      err = VP8_ENC_ERROR_BAD_WRITE;
      goto Error;
    }
  }
  *coded_size = CHUNK_HEADER_SIZE + riff_size;
  return VP8_ENC_OK;

 Error:
  return err;
}